

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccoefct.c
# Opt level: O0

void jinit_c_coef_controller(j_compress_ptr cinfo,boolean need_full_buffer)

{
  code *pcVar1;
  undefined8 *puVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 uVar5;
  long lVar6;
  int in_ESI;
  long in_RDI;
  int i;
  JBLOCKROW buffer;
  jpeg_component_info *compptr;
  int ci;
  my_coef_ptr coef;
  int local_34;
  long local_28;
  int local_1c;
  
  puVar2 = (undefined8 *)(*(code *)**(undefined8 **)(in_RDI + 8))(in_RDI,1,0xc0);
  *(undefined8 **)(in_RDI + 0x208) = puVar2;
  *puVar2 = start_pass_coef;
  if (in_ESI == 0) {
    lVar6 = (**(code **)(*(long *)(in_RDI + 8) + 8))(in_RDI,1,0x500);
    for (local_34 = 0; local_34 < 10; local_34 = local_34 + 1) {
      puVar2[(long)local_34 + 4] = lVar6 + (long)local_34 * 0x80;
    }
    puVar2[0xe] = 0;
  }
  else {
    local_1c = 0;
    local_28 = *(long *)(in_RDI + 0x68);
    for (; local_1c < *(int *)(in_RDI + 0x5c); local_1c = local_1c + 1) {
      pcVar1 = *(code **)(*(long *)(in_RDI + 8) + 0x28);
      uVar3 = jround_up((ulong)*(uint *)(local_28 + 0x1c),(long)*(int *)(local_28 + 8));
      uVar4 = jround_up((ulong)*(uint *)(local_28 + 0x20),(long)*(int *)(local_28 + 0xc));
      uVar5 = (*pcVar1)(in_RDI,1,0,uVar3 & 0xffffffff,uVar4 & 0xffffffff,
                        *(undefined4 *)(local_28 + 0xc));
      puVar2[(long)local_1c + 0xe] = uVar5;
      local_28 = local_28 + 0x60;
    }
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_c_coef_controller (j_compress_ptr cinfo, boolean need_full_buffer)
{
  my_coef_ptr coef;

  coef = (my_coef_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				SIZEOF(my_coef_controller));
  cinfo->coef = (struct jpeg_c_coef_controller *) coef;
  coef->pub.start_pass = start_pass_coef;

  /* Create the coefficient buffer. */
  if (need_full_buffer) {
#ifdef FULL_COEF_BUFFER_SUPPORTED
    /* Allocate a full-image virtual array for each component, */
    /* padded to a multiple of samp_factor DCT blocks in each direction. */
    int ci;
    jpeg_component_info *compptr;

    for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
	 ci++, compptr++) {
      coef->whole_image[ci] = (*cinfo->mem->request_virt_barray)
	((j_common_ptr) cinfo, JPOOL_IMAGE, FALSE,
	 (JDIMENSION) jround_up((long) compptr->width_in_blocks,
				(long) compptr->h_samp_factor),
	 (JDIMENSION) jround_up((long) compptr->height_in_blocks,
				(long) compptr->v_samp_factor),
	 (JDIMENSION) compptr->v_samp_factor);
    }
#else
    ERREXIT(cinfo, JERR_BAD_BUFFER_MODE);
#endif
  } else {
    /* We only need a single-MCU buffer. */
    JBLOCKROW buffer;
    int i;

    buffer = (JBLOCKROW)
      (*cinfo->mem->alloc_large) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				  C_MAX_BLOCKS_IN_MCU * SIZEOF(JBLOCK));
    for (i = 0; i < C_MAX_BLOCKS_IN_MCU; i++) {
      coef->MCU_buffer[i] = buffer + i;
    }
    coef->whole_image[0] = NULL; /* flag for no virtual arrays */
  }
}